

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
::
emplace_new_key<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          convertible_to_value *args)

{
  long lVar1;
  anon_union_96_1_a8c68091_for_sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_3
  *__p;
  long lVar2;
  long lVar3;
  char __tmp;
  ulong uVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
  *this_00;
  undefined7 in_register_00000031;
  size_t sVar5;
  EntryPointer psVar6;
  char __tmp_1;
  sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
  sVar7;
  EntryPointer psVar8;
  char cVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
  pVar12;
  value_type to_insert;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
  local_90;
  
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    uVar4 = CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff;
    sVar7 = SUB81(uVar4,0);
    if (this[0x11] != sVar7) {
      lVar3 = *(long *)(this + 0x18) + 1;
      auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar10._0_8_ = lVar3;
      auVar10._12_4_ = 0x45300000;
      lVar1 = lVar2 + 1;
      auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._0_8_ = lVar1;
      auVar11._12_4_ = 0x45300000;
      if ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x14) *
          ((auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
        if (current_entry->distance_from_desired < '\0') {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ska::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>::convertible_to_value,_true>
                    (&(current_entry->field_1).value,key,args);
          current_entry->distance_from_desired = (int8_t)sVar7;
          *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
          uVar4 = CONCAT71((int7)(uVar4 >> 8),1);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ska::flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>::convertible_to_value,_true>
                    (&local_90,key,args);
          cVar9 = current_entry->distance_from_desired;
          current_entry->distance_from_desired = (int8_t)sVar7;
          __p = &current_entry->field_1;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
          ::swap(&local_90,&__p->value);
          sVar7 = (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                   )(cVar9 + '\x01');
          psVar8 = current_entry + 1;
          cVar9 = current_entry[1].distance_from_desired;
          this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                     *)__p;
          psVar6 = current_entry;
          if (-1 < cVar9) {
            this_00 = &local_90;
            do {
              psVar6 = psVar8;
              if (cVar9 < (char)sVar7) {
                psVar6->distance_from_desired = (int8_t)sVar7;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                ::swap(this_00,&(psVar6->field_1).value);
                sVar7 = (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                         )(cVar9 + '\x01');
              }
              else {
                sVar7 = (sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                         )((char)sVar7 + '\x01');
                if (sVar7 == this[0x11]) {
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
                  ::swap(&local_90,&__p->value);
                  uVar4 = *(long *)(this + 8) * 2 + 2;
                  sVar5 = 4;
                  if (4 < uVar4) {
                    sVar5 = uVar4;
                  }
                  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                  ::rehash((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                            *)this,sVar5);
                  pVar12 = emplace<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>
                                     (this,&local_90);
                  current_entry = (EntryPointer)pVar12.first.current;
                  uVar4 = (ulong)pVar12._8_4_;
                  goto LAB_00231231;
                }
              }
              cVar9 = psVar6[1].distance_from_desired;
              psVar8 = psVar6 + 1;
            } while (-1 < cVar9);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>
          ::pair(&psVar6[1].field_1.value,&local_90);
          psVar8->distance_from_desired = (int8_t)sVar7;
          *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
          uVar4 = CONCAT71((int7)((ulong)this_00 >> 8),1);
LAB_00231231:
          sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
          ::~sherwood_v3_table
                    (&local_90.second.childNodes.
                      super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                    );
          sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
          ::~sherwood_v3_table
                    ((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>
                      *)&local_90.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
            operator_delete(local_90.first._M_dataplus._M_p,
                            local_90.first.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_0023111e;
      }
    }
  }
  uVar4 = lVar2 * 2 + 2;
  sVar5 = 4;
  if (4 < uVar4) {
    sVar5 = uVar4;
  }
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
  ::rehash((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
            *)this,sVar5);
  pVar12 = emplace<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
                     (this,key,args);
  current_entry = (EntryPointer)pVar12.first.current;
  uVar4 = (ulong)pVar12._8_4_;
LAB_0023111e:
  pVar12._8_8_ = uVar4 & 0xffffffff;
  pVar12.first.current = current_entry;
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }